

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_dnd_x.cxx
# Opt level: O3

int Fl::dnd(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Window *this;
  Fl_Window *pFVar4;
  char *pcVar5;
  char *pcVar6;
  Atom *pAVar7;
  Window d0;
  Window *window;
  Window *__stat_loc;
  unsigned_long d3;
  int dest_y;
  int dest_x;
  Window root;
  uint junk3;
  Window child;
  Window *local_d0;
  Fl_Window *local_c8;
  Window *local_a0 [2];
  Window *local_90 [4];
  Window *local_70;
  undefined8 local_68;
  undefined8 local_60;
  long local_58;
  int local_48;
  int local_44;
  undefined8 local_40;
  
  this = first_window();
  pFVar4 = first_window();
  Fl_Window::cursor(pFVar4,FL_CURSOR_MOVE);
  pFVar4 = first_window();
  if (pFVar4->i == (Fl_X *)0x0) {
    d0 = 0;
  }
  else {
    d0 = pFVar4->i->xid;
  }
  fl_local_grab = grabfunc;
  XSetSelectionOwner(fl_display,fl_XdndSelection,fl_message_window);
  if (pushed_ == (Fl_Widget *)0x0) {
    local_d0 = (Window *)0x0;
  }
  else {
    iVar3 = 4;
    local_c8 = (Fl_Window *)0x0;
    local_d0 = (Window *)0x0;
    do {
      local_90[0] = *(Window **)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80);
      XQueryPointer(fl_display,local_90[0],local_a0);
      if (local_90[0] == (Window *)0x0) {
        iVar1 = dnd_aware(local_a0[0]);
        window = (Window *)0x0;
        if (iVar1 != 0) {
          window = local_a0[0];
        }
      }
      else {
        do {
          window = local_90[0];
          pFVar4 = fl_find((Window)local_90[0]);
          if (pFVar4 != (Fl_Window *)0x0) {
            iVar1 = 0;
            goto LAB_001e9127;
          }
          iVar1 = dnd_aware(window);
          if (iVar1 != 0) goto LAB_001e9124;
          XQueryPointer(fl_display,local_90[0],local_a0);
        } while (local_90[0] != (Window *)0x0);
        iVar1 = 0;
      }
LAB_001e9124:
      pFVar4 = (Fl_Window *)0x0;
LAB_001e9127:
      if (window == local_d0) {
        if (local_c8 == (Fl_Window *)0x0) {
          if (iVar3 != 0) goto LAB_001e942b;
          iVar3 = 0;
          __stat_loc = local_d0;
          goto LAB_001e9470;
        }
LAB_001e9255:
        fl_local_grab = (_func_int_int *)0x0;
        e_x = e_x_root - (local_c8->super_Fl_Group).super_Fl_Widget.x_;
        e_y = e_y_root - (local_c8->super_Fl_Group).super_Fl_Widget.y_;
        __stat_loc = (Window *)&DAT_00000015;
        handle(0x15,local_c8);
        fl_local_grab = grabfunc;
      }
      else {
        if (local_c8 == (Fl_Window *)0x0) {
          if (iVar3 != 0) {
            fl_sendClientMessage((Window)local_d0,fl_XdndLeave,d0,0,0,0,0);
          }
        }
        else {
          fl_local_grab = (_func_int_int *)0x0;
          e_x = e_x_root - (local_c8->super_Fl_Group).super_Fl_Widget.x_;
          e_y = e_y_root - (local_c8->super_Fl_Group).super_Fl_Widget.y_;
          local_d0 = (Window *)0x16;
          handle(0x16,local_c8);
          fl_local_grab = grabfunc;
        }
        pcVar6 = fl_selection_buffer[0];
        iVar3 = iVar1;
        if (pFVar4 != (Fl_Window *)0x0) {
          fl_local_grab = (_func_int_int *)0x0;
          e_x = e_x_root - (pFVar4->super_Fl_Group).super_Fl_Widget.x_;
          e_y = e_y_root - (pFVar4->super_Fl_Group).super_Fl_Widget.y_;
          handle(0x14,pFVar4);
          local_d0 = window;
          local_c8 = pFVar4;
          goto LAB_001e9255;
        }
        if (iVar1 == 0) {
          iVar3 = 0;
          __stat_loc = local_d0;
          local_d0 = window;
          goto LAB_001e9470;
        }
        iVar2 = strncmp(fl_selection_buffer[0],"file:///",8);
        if (((((((iVar2 == 0) || (iVar2 = strncmp(pcVar6,"ftp://",6), iVar2 == 0)) ||
               (iVar2 = strncmp(pcVar6,"http://",7), iVar2 == 0)) ||
              ((iVar2 = strncmp(pcVar6,"https://",8), iVar2 == 0 ||
               (iVar2 = strncmp(pcVar6,"ipp://",6), iVar2 == 0)))) ||
             ((iVar2 = strncmp(pcVar6,"ldap:",5), iVar2 == 0 ||
              ((iVar2 = strncmp(pcVar6,"mailto:",7), iVar2 == 0 ||
               (iVar2 = strncmp(pcVar6,"news:",5), iVar2 == 0)))))) ||
            (iVar2 = strncmp(pcVar6,"smb://",6), iVar2 == 0)) &&
           (pcVar5 = strchr(pcVar6,0x20), pcVar5 == (char *)0x0)) {
          pcVar6 = strstr(pcVar6,"\r\n");
          d3 = 0x1f;
          pAVar7 = &fl_XdndURIList;
          if (pcVar6 == (char *)0x0) goto LAB_001e9395;
        }
        else {
LAB_001e9395:
          pAVar7 = &fl_XaUtf8String;
          d3 = 0;
        }
        fl_sendClientMessage((Window)window,fl_XdndEnter,d0,(long)(iVar1 << 0x18),*pAVar7,d3,0);
        local_d0 = window;
LAB_001e942b:
        __stat_loc = local_d0;
        fl_sendClientMessage
                  ((Window)local_d0,fl_XdndPosition,d0,0,(long)(e_x_root << 0x10 | e_y_root),
                   fl_event_time,fl_XdndActionCopy);
LAB_001e9470:
        local_c8 = (Fl_Window *)0x0;
      }
      wait(__stat_loc);
    } while (pushed_ != (Fl_Widget *)0x0);
    if (local_c8 != (Fl_Window *)0x0) {
      fl_i_own_selection[0] = '\x01';
      fl_local_grab = (_func_int_int *)0x0;
      e_x = e_x_root - (local_c8->super_Fl_Group).super_Fl_Widget.x_;
      e_y = e_y_root - (local_c8->super_Fl_Group).super_Fl_Widget.y_;
      iVar3 = handle(0x17,local_c8);
      fl_local_grab = grabfunc;
      if (iVar3 != 0) {
        paste(belowmouse_,0);
      }
      goto LAB_001e954a;
    }
    if (iVar3 == 0) {
      if (local_d0 != (Window *)0x0) {
        local_90[0]._0_4_ = 4;
        local_70 = local_d0;
        local_68 = *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80);
        local_60 = 0;
        local_58 = fl_event_time + 1;
        local_48 = e_x_root;
        local_44 = e_y_root;
        local_40 = 0x200000000;
        XSendEvent(fl_display,local_d0,0,0,local_90);
        local_58 = local_58 + 1;
        local_40 = CONCAT44(local_40._4_4_,0x200);
        local_90[0] = (Window *)CONCAT44(local_90[0]._4_4_,5);
        XSendEvent(fl_display,local_d0,0,0,local_90);
      }
      goto LAB_001e954a;
    }
  }
  fl_sendClientMessage((Window)local_d0,fl_XdndDrop,d0,0,fl_event_time,0,0);
LAB_001e954a:
  fl_local_grab = (_func_int_int *)0x0;
  Fl_Window::cursor(this,FL_CURSOR_DEFAULT);
  return 1;
}

Assistant:

int Fl::dnd() {
  Fl_Window *source_fl_win = Fl::first_window();
  Fl::first_window()->cursor(FL_CURSOR_MOVE);
  Window source_window = fl_xid(Fl::first_window());
  fl_local_grab = grabfunc;
  Window target_window = 0;
  Fl_Window* local_window = 0;
  int dndversion = 4; int dest_x, dest_y;
  XSetSelectionOwner(fl_display, fl_XdndSelection, fl_message_window, fl_event_time);

  while (Fl::pushed()) {

    // figure out what window we are pointing at:
    Window new_window = 0; int new_version = 0;
    Fl_Window* new_local_window = 0;
    for (Window child = RootWindow(fl_display, fl_screen);;) {
      Window root; unsigned int junk3;
      XQueryPointer(fl_display, child, &root, &child,
		    &e_x_root, &e_y_root, &dest_x, &dest_y, &junk3);
      if (!child) {
	if (!new_window && (new_version = dnd_aware(root))) new_window = root;
	break;
      }
      new_window = child;
      if ((new_local_window = fl_find(child))) break;
      if ((new_version = dnd_aware(new_window))) break;
    }

    if (new_window != target_window) {
      if (local_window) {
	local_handle(FL_DND_LEAVE, local_window);
      } else if (dndversion) {
	fl_sendClientMessage(target_window, fl_XdndLeave, source_window);
      }
      dndversion = new_version;
      target_window = new_window;
      local_window = new_local_window;
      if (local_window) {
	local_handle(FL_DND_ENTER, local_window);
      } else if (dndversion) {
        // Send an X-DND message to the target window.  In order to
	// support dragging of files/URLs as well as arbitrary text,
	// we look at the selection buffer - if the buffer starts
	// with a common URI scheme, does not contain spaces, and
	// contains at least one CR LF, then we flag the data as
	// both a URI list (MIME media type "text/uri-list") and
	// plain text.  Otherwise, we just say it is plain text.
        if ((!strncmp(fl_selection_buffer[0], "file:///", 8) ||
	     !strncmp(fl_selection_buffer[0], "ftp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "http://", 7) ||
	     !strncmp(fl_selection_buffer[0], "https://", 8) ||
	     !strncmp(fl_selection_buffer[0], "ipp://", 6) ||
	     !strncmp(fl_selection_buffer[0], "ldap:", 5) ||
	     !strncmp(fl_selection_buffer[0], "mailto:", 7) ||
	     !strncmp(fl_selection_buffer[0], "news:", 5) ||
	     !strncmp(fl_selection_buffer[0], "smb://", 6)) &&
	    !strchr(fl_selection_buffer[0], ' ') &&
	    strstr(fl_selection_buffer[0], "\r\n")) {
	  // Send file/URI list...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XdndURIList, XA_STRING, 0);
        } else {
	  // Send plain text...
	  fl_sendClientMessage(target_window, fl_XdndEnter, source_window,
			       dndversion<<24, fl_XaUtf8String, 0, 0);
	}
      }
    }
    if (local_window) {
      local_handle(FL_DND_DRAG, local_window);
    } else if (dndversion) {
      fl_sendClientMessage(target_window, fl_XdndPosition, source_window,
			   0, (e_x_root<<16)|e_y_root, fl_event_time,
			   fl_XdndActionCopy);
    }
    Fl::wait();
  }

  if (local_window) {
    fl_i_own_selection[0] = 1;
    if (local_handle(FL_DND_RELEASE, local_window)) paste(*belowmouse(), 0);
  } else if (dndversion) {
    fl_sendClientMessage(target_window, fl_XdndDrop, source_window,
			 0, fl_event_time);
  } else if (target_window) {
    // fake a drop by clicking the middle mouse button:
    XButtonEvent msg;
    msg.type = ButtonPress;
    msg.window = target_window;
    msg.root = RootWindow(fl_display, fl_screen);
    msg.subwindow = 0;
    msg.time = fl_event_time+1;
    msg.x = dest_x;
    msg.y = dest_y;
    msg.x_root = Fl::e_x_root;
    msg.y_root = Fl::e_y_root;
    msg.state = 0x0;
    msg.button = Button2;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
    msg.time++;
    msg.state = 0x200;
    msg.type = ButtonRelease;
    XSendEvent(fl_display, target_window, False, 0L, (XEvent*)&msg);
  }

  fl_local_grab = 0;
  source_fl_win->cursor(FL_CURSOR_DEFAULT);
  return 1;
}